

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateVkImpl::InitializePipeline
          (PipelineStateVkImpl *this,GraphicsPipelineStateCreateInfo *CreateInfo)

{
  PRIMITIVE_TOPOLOGY PrimTopology;
  IPipelineStateCache *pSrcPtr;
  RenderDeviceVkImpl *pRVar1;
  GraphicsPipelineData *PipelineDesc;
  RenderPassCache *this_00;
  VkPipelineVertexInputDivisorStateCreateInfoEXT *pVVar2;
  int iVar3;
  RefCntAutoPtr<Diligent::IRenderPass> *this_01;
  RenderPassVkImpl *pObj;
  undefined4 extraout_var;
  IRenderPassVk *pIVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  uint uVar6;
  initializer_list<VkDynamicState> __l;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> DynamicStates;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  vkShaderStages;
  vector<VkFormat,_std::allocator<VkFormat>_> ColorAttachmentFormats;
  VkPipelineInputAssemblyStateCreateInfo InputAssemblyCI;
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ColorBlendAttachmentStates;
  VkPipelineRenderingCreateInfoKHR PipelineRenderingCI;
  VkPipelineDynamicStateCreateInfo DynamicStateCI;
  VkPipelineColorBlendStateCreateInfo BlendStateCI;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ShaderModules;
  VkRect2D ScissorRect;
  VkGraphicsPipelineCreateInfo PipelineCI;
  uint32_t SampleMask [2];
  VkPipelineTessellationStateCreateInfo TessStateCI;
  VkPipelineDepthStencilStateCreateInfo DepthStencilStateCI;
  VkPipelineVertexInputDivisorStateCreateInfoEXT VertexInputDivisorCI;
  VkPipelineVertexInputStateCreateInfo VertexInputStateCI;
  array<VkVertexInputAttributeDescription,_16UL> AttributeDescription;
  VkPipelineMultisampleStateCreateInfo MSStateCI;
  VkPipelineRasterizationStateCreateInfo RasterizerStateCI;
  array<VkVertexInputBindingDivisorDescription,_16UL> VertexBindingDivisors;
  array<VkVertexInputBindingDescription,_16UL> BindingDescriptions;
  allocator_type local_621;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> local_620;
  VkPipelineCache local_608;
  element_type *local_600;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  local_5f8;
  vector<VkFormat,_std::allocator<VkFormat>_> local_5d8;
  PipelineWrapper local_5c0;
  VkPipelineInputAssemblyStateCreateInfo local_5a8;
  VulkanPhysicalDevice *local_588;
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  local_580;
  VkPipelineViewportStateCreateInfo local_568;
  undefined1 local_538 [20];
  uint uStack_524;
  VkFormat *pVStack_520;
  VkVertexInputAttributeDescription local_518;
  VkPipelineDynamicStateCreateInfo local_508;
  undefined1 local_4e8 [32];
  pointer local_4c8;
  float afStack_4c0 [6];
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  local_4a8;
  VkRect2D local_488;
  VkGraphicsPipelineCreateInfo local_470;
  Uint32 local_3e0 [2];
  VkPipelineTessellationStateCreateInfo local_3d8;
  TShaderStages local_3b8;
  undefined1 local_3a0 [104];
  VkPipelineVertexInputDivisorStateCreateInfoEXT local_338;
  VkPipelineVertexInputStateCreateInfo local_318;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  VkVertexInputAttributeDescription local_2c8 [14];
  VkPipelineMultisampleStateCreateInfo local_1e8;
  VkPipelineRasterizationStateCreateInfo local_1b0;
  array<VkVertexInputBindingDivisorDescription,_16UL> local_170;
  array<VkVertexInputBindingDescription,_16UL> local_f0;
  
  local_5f8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  InitInternalObjects<Diligent::GraphicsPipelineStateCreateInfo>
            (&local_3b8,this,CreateInfo,&local_5f8,&local_4a8);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&local_3b8);
  pSrcPtr = (CreateInfo->super_PipelineStateCreateInfo).pPSOCache;
  if (pSrcPtr == (IPipelineStateCache *)0x0) {
    local_608 = (VkPipelineCache)0x0;
  }
  else {
    CheckDynamicType<Diligent::PipelineStateCacheVkImpl,Diligent::IPipelineStateCache>(pSrcPtr);
    local_608 = (VkPipelineCache)pSrcPtr[9].super_IDeviceObject.super_IObject._vptr_IObject;
  }
  pRVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
           .m_pDevice;
  PipelineDesc = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
                 m_pGraphicsPipelineData;
  this_01 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetRenderPassPtr
                      (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  local_588 = (pRVar1->m_PhysicalDevice)._M_t.
              super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              ._M_t.
              super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
              .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  local_600 = (pRVar1->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  memset(&local_470,0,0x90);
  local_470.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_470.pNext = (undefined1 *)0x0;
  local_470.flags = 1;
  local_518.location = 0;
  local_518.binding = 0;
  local_538._16_4_ = 0;
  uStack_524 = 0;
  pVStack_520 = (VkFormat *)0x0;
  local_538._0_8_ = 0;
  local_538._8_8_ = (void *)0x0;
  local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (this_01->m_pObject == (IRenderPass *)0x0) {
    this_00 = (pRVar1->m_ImplicitRenderPassCache)._M_t.
              super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
              ._M_t.
              super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
              .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
    if (this_00 == (RenderPassCache *)0x0) {
      GraphicsPipelineDesc_To_VkPipelineRenderingCreateInfo
                ((VkPipelineRenderingCreateInfoKHR *)local_2e8,&PipelineDesc->Desc,&local_5d8);
      local_518.location = local_2c8[0].location;
      local_518.binding = local_2c8[0].binding;
      local_538._16_4_ = local_2d8._0_4_;
      uStack_524 = local_2d8._4_4_;
      pVStack_520 = (VkFormat *)local_2d8._8_8_;
      local_538._0_8_ = local_2e8._0_8_;
      local_538._8_8_ = local_2e8._8_8_;
      if (((PipelineDesc->Desc).ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_LAST) !=
          PIPELINE_SHADING_RATE_FLAG_NONE) {
        local_470.flags = local_470.flags | 0x200000;
      }
    }
    else {
      RenderPassCache::RenderPassCacheKey::RenderPassCacheKey
                ((RenderPassCacheKey *)local_2e8,(uint)(PipelineDesc->Desc).NumRenderTargets,
                 (uint)(PipelineDesc->Desc).SmplDesc.Count,(PipelineDesc->Desc).RTVFormats,
                 (PipelineDesc->Desc).DSVFormat,
                 (bool)(((PipelineDesc->Desc).ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_LAST) >>
                       1),(PipelineDesc->Desc).ReadOnlyDSV);
      pObj = RenderPassCache::GetRenderPass(this_00,(RenderPassCacheKey *)local_2e8);
      RefCntAutoPtr<Diligent::IRenderPass>::operator=(this_01,(IRenderPass *)pObj);
      if (this_01->m_pObject == (IRenderPass *)0x0) {
        LogError<true,char[38]>
                  (false,"CreateGraphicsPipeline",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0xa3,(char (*) [38])"Failed to create default render pass.");
      }
    }
  }
  local_470.stageCount =
       (int)((ulong)((long)local_5f8.
                           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_5f8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  local_470.pStages =
       local_5f8.
       super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_470.layout = (this->m_PipelineLayout).m_VkPipelineLayout.m_VkObject;
  local_318.vertexAttributeDescriptionCount = 0;
  local_318._36_4_ = 0;
  local_318.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_318.flags = 0;
  local_318.vertexBindingDescriptionCount = 0;
  local_318.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  local_318.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_318._4_4_ = 0;
  local_318.pNext = (VkPipelineVertexInputDivisorStateCreateInfoEXT *)0x0;
  local_338.vertexBindingDivisorCount = 0;
  local_338._20_4_ = 0;
  local_338.pVertexBindingDivisors = (VkVertexInputBindingDivisorDescription *)0x0;
  local_338.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_338._4_4_ = 0;
  local_338.pNext = (void *)0x0;
  InputLayoutDesc_To_VkVertexInputStateCI
            (&(PipelineDesc->Desc).InputLayout,&local_318,&local_338,&local_f0,
             (array<VkVertexInputAttributeDescription,_16UL> *)local_2e8,&local_170);
  local_470.pVertexInputState = &local_318;
  pVVar2 = (VkPipelineVertexInputDivisorStateCreateInfoEXT *)local_318.pNext;
  if ((local_338.vertexBindingDivisorCount != 0) &&
     (pVVar2 = &local_338,
     (pRVar1->
     super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
     ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.
     InstanceDataStepRate == DEVICE_FEATURE_STATE_DISABLED)) {
    FormatString<char[51]>
              ((string *)local_3a0,
               (char (*) [51])"InstanceDataStepRate device feature is not enabled");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_3a0._0_8_,0,0,0);
    }
    if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
      operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
    }
  }
  local_318.pNext = pVVar2;
  local_5a8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_5a8._4_4_ = 0;
  local_5a8.pNext = (void *)0x0;
  local_5a8.flags = 0;
  local_5a8.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  PrimTopology = (PipelineDesc->Desc).PrimitiveTopology;
  if ((7 < PrimTopology) ||
     (local_5a8.primitiveRestartEnable = 1, (0xa4U >> (PrimTopology & 0x1f) & 1) == 0)) {
    local_5a8.primitiveRestartEnable = (VkBool32)(PrimTopology == PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ)
    ;
  }
  local_470.pInputAssemblyState = &local_5a8;
  local_5a8._28_4_ = 0;
  local_470.pTessellationState = &local_3d8;
  local_3d8.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_3d8._4_4_ = 0;
  local_3d8.pNext = (void *)0x0;
  local_3d8.flags = 0;
  local_3d8.patchControlPoints = 0;
  if ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
      .m_Desc.PipelineType == PIPELINE_TYPE_MESH) {
    local_5a8.flags = 0;
    local_5a8.topology = VK_PRIMITIVE_TOPOLOGY_MAX_ENUM;
    local_470.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  else {
    PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount
              (PrimTopology,&local_5a8.topology,&local_3d8.patchControlPoints);
  }
  local_568.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_568._4_4_ = 0;
  local_568.pScissors = (VkRect2D *)0x0;
  local_568.pNext = (void *)0x0;
  local_568.scissorCount._0_1_ = (PipelineDesc->Desc).NumViewports;
  local_568._16_8_ = (ulong)(byte)local_568.scissorCount << 0x20;
  local_568.pViewports = (VkViewport *)0x0;
  local_568._33_7_ = 0;
  local_488.offset.x = 0;
  local_488.offset.y = 0;
  local_488.extent.width = 0;
  local_488.extent.height = 0;
  if ((PipelineDesc->Desc).RasterizerDesc.ScissorEnable == false) {
    local_568.pScissors = &local_488;
    local_488.extent.width = (local_588->m_Properties).limits.maxViewportDimensions[0];
    local_488.extent.height = (local_588->m_Properties).limits.maxViewportDimensions[1];
  }
  local_470.pViewportState = &local_568;
  RasterizerStateDesc_To_VkRasterizationStateCI(&local_1b0,&(PipelineDesc->Desc).RasterizerDesc);
  local_470.pMultisampleState = &local_1e8;
  local_1e8.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_1e8._4_4_ = 0;
  local_1e8.pNext = (void *)0x0;
  local_1e8._16_8_ = (ulong)(PipelineDesc->Desc).SmplDesc.Count << 0x20;
  local_1e8.sampleShadingEnable = 0;
  local_1e8.minSampleShading = 0.0;
  local_3e0[0] = (PipelineDesc->Desc).SampleMask;
  local_1e8.pSampleMask = local_3e0;
  local_3e0[1] = 0;
  local_1e8.alphaToCoverageEnable = 0;
  local_1e8.alphaToOneEnable = 0;
  local_470.pRasterizationState = &local_1b0;
  DepthStencilStateDesc_To_VkDepthStencilStateCI
            ((VkPipelineDepthStencilStateCreateInfo *)local_3a0,
             &(PipelineDesc->Desc).DepthStencilDesc);
  local_470.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)local_3a0;
  if (this_01->m_pObject == (IRenderPass *)0x0) {
    uVar6 = uStack_524;
  }
  else {
    iVar3 = (*(this_01->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    uVar5 = (ulong)(PipelineDesc->Desc).SubpassIndex;
    uVar6 = *(uint *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x20) + 0x10 + uVar5 * 0x48);
    if (((PipelineDesc->Desc).pRenderPass == (IRenderPass *)0x0) &&
       (uVar6 != (PipelineDesc->Desc).NumRenderTargets)) {
      FormatString<char[26],char[97]>
                ((string *)local_4e8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "GraphicsPipeline.pRenderPass != nullptr || GraphicsPipeline.NumRenderTargets == NumRTAttachments"
                 ,(char (*) [97])(uVar5 * 9));
      DebugAssertionFailed
                ((Char *)local_4e8._0_8_,"CreateGraphicsPipeline",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x123);
      if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
        operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
      }
    }
  }
  std::
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::vector(&local_580,(ulong)uVar6,(allocator_type *)local_4e8);
  local_470.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)local_4e8;
  afStack_4c0[0] = 0.0;
  afStack_4c0[1] = 0.0;
  local_4e8._16_8_ = 0;
  afStack_4c0[2] = 0.0;
  afStack_4c0[3] = 0.0;
  local_4e8._0_8_ = (pointer)0x0;
  local_4e8._8_8_ = (void *)0x0;
  local_4c8 = local_580.
              super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (local_580.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_580.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4c8 = (pointer)0x0;
  }
  local_4e8._24_8_ = (ulong)uVar6 << 0x20;
  BlendStateDesc_To_VkBlendStateCI
            ((BlendStateDesc *)PipelineDesc,local_470.pColorBlendState,&local_580);
  local_508.pDynamicStates = (VkDynamicState *)0x0;
  local_508.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_508._4_4_ = 0;
  local_508.pNext = (void *)0x0;
  local_508.flags = 0;
  local_508.dynamicStateCount = 0;
  local_5c0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _0_4_ = 0;
  local_5c0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
  _4_4_ = 4;
  local_5c0.m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 8;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_5c0;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector(&local_620,__l,&local_621);
  if ((PipelineDesc->Desc).RasterizerDesc.ScissorEnable == true) {
    local_5c0.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = 1;
    if (local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::
      _M_realloc_insert<VkDynamicState>
                (&local_620,
                 (iterator)
                 local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(VkDynamicState *)&local_5c0);
    }
    else {
      *local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_finish = VK_DYNAMIC_STATE_SCISSOR;
      local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  if (((PipelineDesc->Desc).ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE) &&
     ((((pRVar1->m_LogicalVkDevice).
        super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate != 0)) {
    local_5c0.m_pLogicalDevice.
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr._0_4_ = 0x3b9e3cd0;
    if (local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::
      _M_realloc_insert<VkDynamicState>
                (&local_620,
                 (iterator)
                 local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(VkDynamicState *)&local_5c0);
    }
    else {
      *local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_finish = VK_DYNAMIC_STATE_FRAGMENT_SHADING_RATE_KHR;
      local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  local_470.pDynamicState = &local_508;
  local_508.dynamicStateCount =
       (uint32_t)
       ((ulong)((long)local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_508.pDynamicStates =
       local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  if (this_01->m_pObject == (IRenderPass *)0x0) {
    local_470.pNext = local_538;
  }
  else {
    pIVar4 = RefCntAutoPtr<Diligent::IRenderPass>::RawPtr<Diligent::IRenderPassVk>(this_01);
    iVar3 = (*(pIVar4->super_IRenderPass).super_IDeviceObject.super_IObject._vptr_IObject[8])
                      (pIVar4);
    local_470.renderPass = (VkRenderPass)CONCAT44(extraout_var_00,iVar3);
  }
  local_470.subpass = (uint32_t)(PipelineDesc->Desc).SubpassIndex;
  local_470.basePipelineHandle = (VkPipeline)0x0;
  local_470.basePipelineIndex = -1;
  VulkanUtilities::VulkanLogicalDevice::CreateGraphicsPipeline
            (&local_5c0,local_600,&local_470,local_608,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  operator=(&this->m_Pipeline,&local_5c0);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper(&local_5c0);
  if (local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_620.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_620.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_620.
                          super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_580.
      super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_580.
                    super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_580.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_580.
                          super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5d8.super__Vector_base<VkFormat,_std::allocator<VkFormat>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::~vector(&local_4a8);
  if (local_5f8.
      super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f8.
                    super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PipelineStateVkImpl::InitializePipeline(const GraphicsPipelineStateCreateInfo& CreateInfo)
{
    std::vector<VkPipelineShaderStageCreateInfo>      vkShaderStages;
    std::vector<VulkanUtilities::ShaderModuleWrapper> ShaderModules;

    InitInternalObjects(CreateInfo, vkShaderStages, ShaderModules);

    const VkPipelineCache vkSPOCache = CreateInfo.pPSOCache != nullptr ? ClassPtrCast<PipelineStateCacheVkImpl>(CreateInfo.pPSOCache)->GetVkPipelineCache() : VK_NULL_HANDLE;
    CreateGraphicsPipeline(m_pDevice, vkShaderStages, m_PipelineLayout, m_Desc, m_pGraphicsPipelineData->Desc, m_Pipeline, GetRenderPassPtr(), vkSPOCache);
}